

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_event.c
# Opt level: O3

int luv_new_fs_event(lua_State *L)

{
  int iVar1;
  uv_fs_event_t *handle;
  uv_loop_t *loop;
  luv_handle_t *plVar2;
  
  handle = (uv_fs_event_t *)luv_newuserdata(L,0x88);
  loop = luv_loop(L);
  iVar1 = uv_fs_event_init(loop,handle);
  if (iVar1 < 0) {
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    plVar2 = luv_setup_handle(L);
    handle->data = plVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_new_fs_event(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_fs_event_t* handle = (uv_fs_event_t*)luv_newuserdata(L, sizeof(*handle));
  int ret = uv_fs_event_init(ctx->loop, handle);
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}